

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O0

void simgui_setup(simgui_desc_t *desc)

{
  _Bool _Var1;
  ImGuiStyle *dst;
  float local_15b4;
  wchar_t local_15b0;
  sg_vertex_attr_desc *attr_2;
  sg_vertex_attr_desc *attr_1;
  sg_vertex_attr_desc *attr;
  sg_pipeline_desc pip_desc;
  sg_shader_uniform_block_desc *ub;
  sg_shader_desc shd_desc;
  undefined1 local_798 [8];
  sg_image_desc img_desc;
  int local_f8;
  wchar_t bytes_per_pixel;
  wchar_t font_height;
  wchar_t font_width;
  uchar *font_pixels;
  undefined1 local_e0 [8];
  sg_buffer_desc ib_desc;
  undefined1 local_78 [8];
  sg_buffer_desc vb_desc;
  ImGuiIO *io;
  simgui_desc_t *desc_local;
  
  if (desc == (simgui_desc_t *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x655,"void simgui_setup(const simgui_desc_t *)");
  }
  memset(&_simgui,0,0x468);
  memcpy(&_simgui,desc,0x28);
  if (_simgui.desc.max_vertices == L'\0') {
    local_15b0 = L'𐀀';
  }
  else {
    local_15b0 = _simgui.desc.max_vertices;
  }
  _simgui.desc.max_vertices = local_15b0;
  if ((_simgui.desc.dpi_scale != 0.0) || (NAN(_simgui.desc.dpi_scale))) {
    local_15b4 = _simgui.desc.dpi_scale;
  }
  else {
    local_15b4 = 1.0;
  }
  _simgui.desc.dpi_scale = local_15b4;
  _simgui.is_osx = _simgui_is_osx();
  if (_simgui.desc.max_vertices < L'\x01') {
    __assert_fail("_simgui.desc.max_vertices > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x662,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui.vertices.size = (long)_simgui.desc.max_vertices * 0x14;
  _simgui.vertices.ptr = malloc(_simgui.vertices.size);
  if (_simgui.vertices.ptr == (void *)0x0) {
    __assert_fail("_simgui.vertices.ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x665,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui.indices.size = (long)_simgui.desc.max_vertices * 6;
  _simgui.indices.ptr = malloc(_simgui.indices.size);
  if (_simgui.indices.ptr != (void *)0x0) {
    igCreateContext((ImFontAtlas *)0x0);
    dst = igGetStyle();
    igStyleColorsDark(dst);
    vb_desc._88_8_ = igGetIO();
    if ((_simgui.desc.no_default_font & 1U) == 0) {
      ImFontAtlas_AddFontDefault(((ImGuiIO *)vb_desc._88_8_)->Fonts,(ImFontConfig *)0x0);
    }
    *(char **)(vb_desc._88_8_ + 0x18) = _simgui.desc.ini_filename;
    _Var1 = _simgui_is_osx();
    *(_Bool *)(vb_desc._88_8_ + 0xc9) = _Var1;
    *(uint *)(vb_desc._88_8_ + 4) = *(uint *)(vb_desc._88_8_ + 4) | 8;
    *(undefined4 *)(vb_desc._88_8_ + 0x34) = 0x102;
    *(undefined4 *)(vb_desc._88_8_ + 0x38) = 0x107;
    *(undefined4 *)(vb_desc._88_8_ + 0x3c) = 0x106;
    *(undefined4 *)(vb_desc._88_8_ + 0x40) = 0x109;
    *(undefined4 *)(vb_desc._88_8_ + 0x44) = 0x108;
    *(undefined4 *)(vb_desc._88_8_ + 0x48) = 0x10a;
    *(undefined4 *)(vb_desc._88_8_ + 0x4c) = 0x10b;
    *(undefined4 *)(vb_desc._88_8_ + 0x50) = 0x10c;
    *(undefined4 *)(vb_desc._88_8_ + 0x54) = 0x10d;
    *(undefined4 *)(vb_desc._88_8_ + 0x5c) = 0x105;
    *(undefined4 *)(vb_desc._88_8_ + 0x60) = 0x103;
    *(undefined4 *)(vb_desc._88_8_ + 100) = 0x20;
    *(undefined4 *)(vb_desc._88_8_ + 0x68) = 0x101;
    *(undefined4 *)(vb_desc._88_8_ + 0x6c) = 0x100;
    if ((_simgui.desc.disable_hotkeys & 1U) == 0) {
      *(undefined4 *)(vb_desc._88_8_ + 0x74) = 0x41;
      *(undefined4 *)(vb_desc._88_8_ + 0x78) = 0x43;
      *(undefined4 *)(vb_desc._88_8_ + 0x7c) = 0x56;
      *(undefined4 *)(vb_desc._88_8_ + 0x80) = 0x58;
      *(undefined4 *)(vb_desc._88_8_ + 0x84) = 0x59;
      *(undefined4 *)(vb_desc._88_8_ + 0x88) = 0x5a;
    }
    *(code **)(vb_desc._88_8_ + 0x108) = _simgui_set_clipboard;
    *(code **)(vb_desc._88_8_ + 0x100) = _simgui_get_clipboard;
    sg_push_debug_group("sokol-imgui");
    memset(local_78,0,0x60);
    vb_desc.size._4_4_ = 3;
    vb_desc._0_8_ = _simgui.vertices.size;
    vb_desc.data.size = (size_t)anon_var_dwarf_567f5;
    _simgui.vbuf = sg_make_buffer((sg_buffer_desc *)local_78);
    ib_desc._92_4_ = _simgui.vbuf;
    memset(local_e0,0,0x60);
    ib_desc.size._0_4_ = 2;
    ib_desc.size._4_4_ = 3;
    ib_desc._0_8_ = _simgui.indices.size;
    ib_desc.data.size = (size_t)anon_var_dwarf_56801;
    _simgui.ibuf = sg_make_buffer((sg_buffer_desc *)local_e0);
    font_pixels._4_4_ = _simgui.ibuf;
    if ((_simgui.desc.no_default_font & 1U) == 0) {
      ImFontAtlas_GetTexDataAsRGBA32
                (*(ImFontAtlas **)(vb_desc._88_8_ + 0xa0),(uchar **)&font_height,&bytes_per_pixel,
                 &local_f8,(int *)&img_desc.field_0x694);
      memset(local_798,0,0x698);
      img_desc.type = bytes_per_pixel;
      img_desc._8_4_ = local_f8;
      img_desc.num_mipmaps = 0x17;
      img_desc.min_filter = SG_FILTER_LINEAR;
      img_desc.mag_filter = SG_FILTER_LINEAR;
      img_desc.pixel_format = SG_PIXELFORMAT_R8;
      img_desc.sample_count = 2;
      img_desc._72_8_ = _font_height;
      img_desc.data.subimage[0][0].ptr = (void *)((long)(bytes_per_pixel * local_f8) << 2);
      img_desc.data.subimage[5][0xf].size = (size_t)anon_var_dwarf_5680d;
      shd_desc._2980_4_ = sg_make_image((sg_image_desc *)local_798);
      _simgui.img = (sg_image)shd_desc._2980_4_;
      *(ulong *)(*(long *)(vb_desc._88_8_ + 0xa0) + 8) = (ulong)(uint)shd_desc._2980_4_;
    }
    memset(&ub,0,0xba8);
    shd_desc._0_8_ = (long)"Align label with current X position" + 0x1b;
    shd_desc.attrs[0]._16_8_ = anon_var_dwarf_56831;
    shd_desc.attrs[1]._16_8_ = anon_var_dwarf_5683d;
    shd_desc.attrs[0].name = "TEXCOORD";
    shd_desc.attrs[0].sem_name._0_4_ = 0;
    shd_desc.attrs[1].name = "TEXCOORD";
    shd_desc.attrs[1].sem_name._0_4_ = 1;
    shd_desc.attrs[2].name = "TEXCOORD";
    shd_desc.attrs[2].sem_name._0_4_ = 2;
    shd_desc.vs.d3d11_target = (char *)0x10;
    shd_desc.vs.uniform_blocks[0].size = (long)"aim_line_vs_params" + 9;
    shd_desc.vs.uniform_blocks[0].uniforms[0].name._0_4_ = 4;
    shd_desc.vs.uniform_blocks[0].uniforms[0].name._4_4_ = 1;
    shd_desc.fs.uniform_blocks[3].uniforms[0xf]._8_8_ =
         (long)"(gl_shd_img->gl_tex_slot != -1) && gl_tex" + 0x26;
    shd_desc.fs.images[0].name._0_4_ = 1;
    shd_desc.fs.images[0].name._4_4_ = 1;
    shd_desc.fs.images[0xb]._8_8_ = anon_var_dwarf_5686d;
    shd_desc.attrs[0xf]._16_8_ = _simgui_vs_source_glsl330;
    shd_desc.vs.images[0xb]._8_8_ = _simgui_fs_source_glsl330;
    _simgui.shd = sg_make_shader((sg_shader_desc *)&ub);
    pip_desc._564_4_ = _simgui.shd;
    memset(&attr,0,0x238);
    pip_desc._start_canary = 0x14;
    pip_desc.layout.buffers[7].step_rate = 0;
    pip_desc.layout.attrs[0].buffer_index = 2;
    pip_desc.layout.attrs[0].format = SG_VERTEXFORMAT_UBYTE4N;
    pip_desc.layout.attrs[1].buffer_index = 2;
    pip_desc.layout.attrs[1].format = _SG_VERTEXFORMAT_NUM;
    pip_desc.layout.attrs[2].buffer_index = 8;
    attr._4_4_ = _simgui.shd.id;
    pip_desc.colors[3].blend.op_alpha = SG_BLENDOP_SUBTRACT;
    pip_desc.cull_mode = _simgui.desc.sample_count;
    pip_desc.layout.attrs[0xf].offset = _simgui.desc.depth_format;
    pip_desc.stencil.read_mask = (undefined1)_simgui.desc.color_format;
    pip_desc.stencil.write_mask = _simgui.desc.color_format._1_1_;
    pip_desc.stencil.ref = _simgui.desc.color_format._2_1_;
    pip_desc.stencil._39_1_ = _simgui.desc.color_format._3_1_;
    pip_desc.color_count = 7;
    pip_desc.colors[0].pixel_format._0_1_ = SG_PIXELFORMAT_NONE;
    pip_desc.colors[0].write_mask = SG_COLORMASK_RB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend._1_3_ = 0;
    pip_desc._544_8_ = anon_var_dwarf_56879;
    _simgui.pip = sg_make_pipeline((sg_pipeline_desc *)&attr);
    sg_pop_debug_group();
    return;
  }
  __assert_fail("_simgui.indices.ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                ,0x668,"void simgui_setup(const simgui_desc_t *)");
}

Assistant:

SOKOL_API_IMPL void simgui_setup(const simgui_desc_t* desc) {
    SOKOL_ASSERT(desc);
    memset(&_simgui, 0, sizeof(_simgui));
    _simgui.desc = *desc;
    _simgui.desc.max_vertices = _simgui_def(_simgui.desc.max_vertices, 65536);
    _simgui.desc.dpi_scale = _simgui_def(_simgui.desc.dpi_scale, 1.0f);
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
    _simgui.is_osx = _simgui_is_osx();
    #endif
    /* can keep color_format, depth_format and sample_count as is,
       since sokol_gfx.h will do its own default-value handling
    */

    /* allocate an intermediate vertex- and index-buffer */
    SOKOL_ASSERT(_simgui.desc.max_vertices > 0);
    _simgui.vertices.size = (size_t)_simgui.desc.max_vertices * sizeof(ImDrawVert);
    _simgui.vertices.ptr = SOKOL_MALLOC(_simgui.vertices.size);
    SOKOL_ASSERT(_simgui.vertices.ptr);
    _simgui.indices.size = (size_t)_simgui.desc.max_vertices * 3 * sizeof(ImDrawIdx);
    _simgui.indices.ptr = SOKOL_MALLOC(_simgui.indices.size);
    SOKOL_ASSERT(_simgui.indices.ptr);

    /* initialize Dear ImGui */
    #if defined(__cplusplus)
        ImGui::CreateContext();
        ImGui::StyleColorsDark();
        ImGuiIO* io = &ImGui::GetIO();
        if (!_simgui.desc.no_default_font) {
            io->Fonts->AddFontDefault();
        }
    #else
        igCreateContext(NULL);
        igStyleColorsDark(igGetStyle());
        ImGuiIO* io = igGetIO();
        if (!_simgui.desc.no_default_font) {
            ImFontAtlas_AddFontDefault(io->Fonts, NULL);
        }
    #endif
    io->IniFilename = _simgui.desc.ini_filename;
    io->ConfigMacOSXBehaviors = _simgui_is_osx();
    io->BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        io->KeyMap[ImGuiKey_Tab] = SAPP_KEYCODE_TAB;
        io->KeyMap[ImGuiKey_LeftArrow] = SAPP_KEYCODE_LEFT;
        io->KeyMap[ImGuiKey_RightArrow] = SAPP_KEYCODE_RIGHT;
        io->KeyMap[ImGuiKey_UpArrow] = SAPP_KEYCODE_UP;
        io->KeyMap[ImGuiKey_DownArrow] = SAPP_KEYCODE_DOWN;
        io->KeyMap[ImGuiKey_PageUp] = SAPP_KEYCODE_PAGE_UP;
        io->KeyMap[ImGuiKey_PageDown] = SAPP_KEYCODE_PAGE_DOWN;
        io->KeyMap[ImGuiKey_Home] = SAPP_KEYCODE_HOME;
        io->KeyMap[ImGuiKey_End] = SAPP_KEYCODE_END;
        io->KeyMap[ImGuiKey_Delete] = SAPP_KEYCODE_DELETE;
        io->KeyMap[ImGuiKey_Backspace] = SAPP_KEYCODE_BACKSPACE;
        io->KeyMap[ImGuiKey_Space] = SAPP_KEYCODE_SPACE;
        io->KeyMap[ImGuiKey_Enter] = SAPP_KEYCODE_ENTER;
        io->KeyMap[ImGuiKey_Escape] = SAPP_KEYCODE_ESCAPE;
        if (!_simgui.desc.disable_hotkeys) {
            io->KeyMap[ImGuiKey_A] = SAPP_KEYCODE_A;
            io->KeyMap[ImGuiKey_C] = SAPP_KEYCODE_C;
            io->KeyMap[ImGuiKey_V] = SAPP_KEYCODE_V;
            io->KeyMap[ImGuiKey_X] = SAPP_KEYCODE_X;
            io->KeyMap[ImGuiKey_Y] = SAPP_KEYCODE_Y;
            io->KeyMap[ImGuiKey_Z] = SAPP_KEYCODE_Z;
        }
        #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        io->SetClipboardTextFn = _simgui_set_clipboard;
        io->GetClipboardTextFn = _simgui_get_clipboard;
        #endif
    #endif

    /* create sokol-gfx resources */
    sg_push_debug_group("sokol-imgui");

    /* NOTE: since we're in C++ mode here we can't use C99 designated init */
    sg_buffer_desc vb_desc;
    memset(&vb_desc, 0, sizeof(vb_desc));
    vb_desc.usage = SG_USAGE_STREAM;
    vb_desc.size = _simgui.vertices.size;
    vb_desc.label = "sokol-imgui-vertices";
    _simgui.vbuf = sg_make_buffer(&vb_desc);

    sg_buffer_desc ib_desc;
    memset(&ib_desc, 0, sizeof(ib_desc));
    ib_desc.type = SG_BUFFERTYPE_INDEXBUFFER;
    ib_desc.usage = SG_USAGE_STREAM;
    ib_desc.size = _simgui.indices.size;
    ib_desc.label = "sokol-imgui-indices";
    _simgui.ibuf = sg_make_buffer(&ib_desc);

    /* default font texture */
    if (!_simgui.desc.no_default_font) {
        unsigned char* font_pixels;
        int font_width, font_height;
        #if defined(__cplusplus)
            io->Fonts->GetTexDataAsRGBA32(&font_pixels, &font_width, &font_height);
        #else
            int bytes_per_pixel;
            ImFontAtlas_GetTexDataAsRGBA32(io->Fonts, &font_pixels, &font_width, &font_height, &bytes_per_pixel);
        #endif
        sg_image_desc img_desc;
        memset(&img_desc, 0, sizeof(img_desc));
        img_desc.width = font_width;
        img_desc.height = font_height;
        img_desc.pixel_format = SG_PIXELFORMAT_RGBA8;
        img_desc.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.min_filter = SG_FILTER_LINEAR;
        img_desc.mag_filter = SG_FILTER_LINEAR;
        img_desc.data.subimage[0][0].ptr = font_pixels;
        img_desc.data.subimage[0][0].size = (size_t)(font_width * font_height) * sizeof(uint32_t);
        img_desc.label = "sokol-imgui-font";
        _simgui.img = sg_make_image(&img_desc);
        io->Fonts->TexID = (ImTextureID)(uintptr_t) _simgui.img.id;
    }

    /* shader object for using the embedded shader source (or bytecode) */
    sg_shader_desc shd_desc;
    memset(&shd_desc, 0, sizeof(shd_desc));
    shd_desc.attrs[0].name = "position";
    shd_desc.attrs[1].name = "texcoord0";
    shd_desc.attrs[2].name = "color0";
    shd_desc.attrs[0].sem_name = "TEXCOORD";
    shd_desc.attrs[0].sem_index = 0;
    shd_desc.attrs[1].sem_name = "TEXCOORD";
    shd_desc.attrs[1].sem_index = 1;
    shd_desc.attrs[2].sem_name = "TEXCOORD";
    shd_desc.attrs[2].sem_index = 2;
    sg_shader_uniform_block_desc* ub = &shd_desc.vs.uniform_blocks[0];
    ub->size = sizeof(_simgui_vs_params_t);
    ub->uniforms[0].name = "vs_params";
    ub->uniforms[0].type = SG_UNIFORMTYPE_FLOAT4;
    ub->uniforms[0].array_count = 1;
    shd_desc.fs.images[0].name = "tex";
    shd_desc.fs.images[0].image_type = SG_IMAGETYPE_2D;
    shd_desc.fs.images[0].sampler_type = SG_SAMPLERTYPE_FLOAT;
    shd_desc.label = "sokol-imgui-shader";
    #if defined(SOKOL_GLCORE33)
        shd_desc.vs.source = _simgui_vs_source_glsl330;
        shd_desc.fs.source = _simgui_fs_source_glsl330;
    #elif defined(SOKOL_GLES2) || defined(SOKOL_GLES3)
        shd_desc.vs.source = _simgui_vs_source_glsl100;
        shd_desc.fs.source = _simgui_fs_source_glsl100;
    #elif defined(SOKOL_METAL)
        shd_desc.vs.entry = "main0";
        shd_desc.fs.entry = "main0";
        switch (sg_query_backend()) {
            case SG_BACKEND_METAL_MACOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_macos);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_macos);
                break;
            case SG_BACKEND_METAL_IOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_ios);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_ios);
                break;
            default:
                shd_desc.vs.source = _simgui_vs_source_metal_sim;
                shd_desc.fs.source = _simgui_fs_source_metal_sim;
                break;
        }
    #elif defined(SOKOL_D3D11)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_hlsl4);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_hlsl4);
    #elif defined(SOKOL_WGPU)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_wgpu);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_wgpu);
    #else
        shd_desc.vs.source = _simgui_vs_source_dummy;
        shd_desc.fs.source = _simgui_fs_source_dummy;
    #endif
    _simgui.shd = sg_make_shader(&shd_desc);

    /* pipeline object for imgui rendering */
    sg_pipeline_desc pip_desc;
    memset(&pip_desc, 0, sizeof(pip_desc));
    pip_desc.layout.buffers[0].stride = sizeof(ImDrawVert);
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[0];
        attr->offset = offsetof(ImDrawVert, pos);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[1];
        attr->offset = offsetof(ImDrawVert, uv);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[2];
        attr->offset = offsetof(ImDrawVert, col);
        attr->format = SG_VERTEXFORMAT_UBYTE4N;
    }
    pip_desc.shader = _simgui.shd;
    pip_desc.index_type = SG_INDEXTYPE_UINT16;
    pip_desc.sample_count = _simgui.desc.sample_count;
    pip_desc.depth.pixel_format = _simgui.desc.depth_format;
    pip_desc.colors[0].pixel_format = _simgui.desc.color_format;
    pip_desc.colors[0].write_mask = SG_COLORMASK_RGB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
    pip_desc.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
    pip_desc.label = "sokol-imgui-pipeline";
    _simgui.pip = sg_make_pipeline(&pip_desc);

    sg_pop_debug_group();
}